

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

pos_t check_line_directive_args(c2m_ctx_t c2m_ctx,VARR_token_t *buffer)

{
  token_t ptVar1;
  undefined8 uVar2;
  pos_t pVar3;
  int iVar4;
  size_t sVar5;
  token_t *pptVar6;
  ulong uVar7;
  int *piVar8;
  unsigned_long_long l;
  int lno;
  pos_t pos;
  char *fname;
  token_t *buffer_arr;
  size_t len;
  size_t i;
  VARR_token_t *buffer_local;
  c2m_ctx_t c2m_ctx_local;
  ulong local_10;
  
  sVar5 = VARR_token_tlength(buffer);
  pptVar6 = VARR_token_taddr(buffer);
  if (sVar5 == 0) {
    c2m_ctx_local = (c2m_ctx_t)(char *)0x0;
    local_10._0_4_ = -1;
    local_10._4_4_ = -1;
  }
  else {
    uVar7 = (ulong)(int)(uint)((short)*(undefined4 *)*pptVar6 == 0x20);
    pos._8_8_ = (pptVar6[uVar7]->pos).fname;
    if ((uVar7 < sVar5) && ((short)*(undefined4 *)pptVar6[uVar7] == 0x100)) {
      iVar4 = digits_p(pptVar6[uVar7]->repr);
      if (iVar4 == 0) {
        c2m_ctx_local = (c2m_ctx_t)(char *)0x0;
        local_10._0_4_ = -1;
        local_10._4_4_ = -1;
      }
      else {
        piVar8 = __errno_location();
        *piVar8 = 0;
        local_10 = strtoll(pptVar6[uVar7]->repr,(char **)0x0,10);
        piVar8 = __errno_location();
        if ((*piVar8 != 0) || (0x7fffffff < local_10)) {
          ptVar1 = pptVar6[uVar7];
          uVar2._0_4_ = (ptVar1->pos).lno;
          uVar2._4_4_ = (ptVar1->pos).ln_pos;
          error(c2m_ctx,0x1d7db7,(ptVar1->pos).fname,uVar2,pptVar6[uVar7]->repr);
        }
        len = uVar7 + 1;
        if ((len < sVar5) && ((short)*(undefined4 *)pptVar6[len] == 0x20)) {
          len = uVar7 + 2;
        }
        if ((len < sVar5) && ((short)*(undefined4 *)pptVar6[len] == 0x102)) {
          pos._8_8_ = (pptVar6[len]->node->u).s.s;
          len = len + 1;
        }
        if (len == sVar5) {
          c2m_ctx_local = (c2m_ctx_t)pos._8_8_;
          local_10 = local_10 & 0xffffffff;
        }
        else {
          c2m_ctx_local = (c2m_ctx_t)(char *)0x0;
          local_10._0_4_ = -1;
          local_10._4_4_ = -1;
        }
      }
    }
    else {
      c2m_ctx_local = (c2m_ctx_t)(char *)0x0;
      local_10._0_4_ = -1;
      local_10._4_4_ = -1;
    }
  }
  pVar3.lno = (undefined4)local_10;
  pVar3.ln_pos = local_10._4_4_;
  pVar3.fname = (char *)c2m_ctx_local;
  return pVar3;
}

Assistant:

static pos_t check_line_directive_args (c2m_ctx_t c2m_ctx, VARR (token_t) * buffer) {
  size_t i, len = VARR_LENGTH (token_t, buffer);
  token_t *buffer_arr = VARR_ADDR (token_t, buffer);
  const char *fname;
  pos_t pos;
  int lno;
  unsigned long long l;

  if (len == 0) return no_pos;
  i = buffer_arr[0]->code == ' ' ? 1 : 0;
  fname = buffer_arr[i]->pos.fname;
  if (i >= len || buffer_arr[i]->code != T_NUMBER) return no_pos;
  if (!digits_p (buffer_arr[i]->repr)) return no_pos;
  errno = 0;
  l = strtoll (buffer_arr[i]->repr, NULL, 10);
  lno = (int) l;
  if (errno || l > ((1ul << 31) - 1))
    error (c2m_ctx, buffer_arr[i]->pos, "#line with too big value: %s", buffer_arr[i]->repr);
  i++;
  if (i < len && buffer_arr[i]->code == ' ') i++;
  if (i < len && buffer_arr[i]->code == T_STR) {
    fname = buffer_arr[i]->node->u.s.s;
    i++;
  }
  if (i == len) {
    pos.fname = fname;
    pos.lno = lno;
    pos.ln_pos = 0;
    return pos;
  }
  return no_pos;
}